

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiFeatureInfo.cpp
# Opt level: O0

void __thiscall
vkt::api::anon_unknown_0::CheckEnumerateDeviceExtensionPropertiesIncompleteResult::
~CheckEnumerateDeviceExtensionPropertiesIncompleteResult
          (CheckEnumerateDeviceExtensionPropertiesIncompleteResult *this)

{
  CheckEnumerateDeviceExtensionPropertiesIncompleteResult *this_local;
  
  (this->super_CheckIncompleteResult<vk::VkExtensionProperties>)._vptr_CheckIncompleteResult =
       (_func_int **)&PTR__CheckEnumerateDeviceExtensionPropertiesIncompleteResult_0165e180;
  std::__cxx11::string::~string((string *)&this->m_layerName);
  CheckIncompleteResult<vk::VkExtensionProperties>::~CheckIncompleteResult
            (&this->super_CheckIncompleteResult<vk::VkExtensionProperties>);
  return;
}

Assistant:

CheckEnumerateDeviceExtensionPropertiesIncompleteResult (std::string layerName = std::string()) : m_layerName(layerName) {}